

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int mbedtls_x509_crt_parse_der(mbedtls_x509_crt *chain,uchar *buf,size_t buflen)

{
  size_t __n;
  ulong uVar1;
  int iVar2;
  mbedtls_x509_crt *pmVar3;
  uchar *puVar4;
  mbedtls_x509_crt *pmVar5;
  uchar *__size;
  mbedtls_x509_crt *crt;
  uchar *end;
  mbedtls_x509_crt *pmVar6;
  int iVar7;
  uchar *p;
  size_t len;
  mbedtls_x509_buf sig_params1;
  size_t len_1;
  mbedtls_x509_buf sig_params2;
  uchar *local_b0;
  mbedtls_x509_crt *local_a8;
  ulong local_a0;
  int *local_98;
  uchar *local_90;
  mbedtls_x509_buf local_88;
  size_t local_70;
  mbedtls_x509_buf local_68;
  mbedtls_x509_buf local_48;
  
  if (buf == (uchar *)0x0 || chain == (mbedtls_x509_crt *)0x0) {
    return -0x2800;
  }
  pmVar3 = chain;
  pmVar5 = (mbedtls_x509_crt *)0x0;
  do {
    pmVar6 = pmVar5;
    pmVar5 = pmVar3;
    crt = pmVar5;
    if (pmVar5->version == 0) goto LAB_0011bd77;
    pmVar3 = pmVar5->next;
  } while (pmVar5->next != (mbedtls_x509_crt *)0x0);
  if ((pmVar5->version != 0) && (pmVar5->next == (mbedtls_x509_crt *)0x0)) {
    pmVar3 = (mbedtls_x509_crt *)calloc(1,0x228);
    pmVar5->next = pmVar3;
    if (pmVar3 == (mbedtls_x509_crt *)0x0) {
      return -0x2880;
    }
    memset(pmVar3,0,0x228);
    crt = pmVar5->next;
    pmVar6 = pmVar5;
  }
LAB_0011bd77:
  local_88.tag = 0;
  local_88._4_4_ = 0;
  local_88.len = 0;
  local_88.p = (uchar *)0x0;
  local_48.tag = 0;
  local_48._4_4_ = 0;
  local_48.len = 0;
  local_48.p = (uchar *)0x0;
  local_68.tag = 0;
  local_68._4_4_ = 0;
  local_68.len = 0;
  local_68.p = (uchar *)0x0;
  iVar2 = -0x2800;
  if ((buf == (uchar *)0x0) || (crt == (mbedtls_x509_crt *)0x0)) goto LAB_0011befa;
  local_b0 = buf;
  local_a0 = buflen;
  iVar2 = mbedtls_asn1_get_tag(&local_b0,buf + buflen,&local_a0,0x30);
  uVar1 = local_a0;
  if (iVar2 != 0) {
    mbedtls_x509_crt_free(crt);
    iVar2 = -0x2180;
    goto LAB_0011befa;
  }
  local_a8 = chain;
  if ((ulong)((long)(buf + buflen) - (long)local_b0) < local_a0) {
    mbedtls_x509_crt_free(crt);
LAB_0011be1e:
    iVar2 = -0x21e6;
    chain = local_a8;
  }
  else {
    __size = local_b0 + (local_a0 - (long)buf);
    (crt->raw).len = (size_t)__size;
    puVar4 = (uchar *)calloc(1,(size_t)__size);
    (crt->raw).p = puVar4;
    if (puVar4 == (uchar *)0x0) {
      iVar2 = -0x2880;
      local_b0 = (uchar *)0x0;
      chain = local_a8;
      goto LAB_0011befa;
    }
    local_b0 = puVar4;
    memcpy(puVar4,buf,(size_t)__size);
    local_b0 = puVar4 + ((long)__size - uVar1);
    (crt->tbs).p = local_b0;
    iVar2 = mbedtls_asn1_get_tag(&local_b0,puVar4 + (long)__size,&local_a0,0x30);
    if (iVar2 != 0) {
      mbedtls_x509_crt_free(crt);
      iVar2 = iVar2 + -0x2180;
      chain = local_a8;
      goto LAB_0011befa;
    }
    end = local_b0 + local_a0;
    (crt->tbs).len = (long)end - (long)(crt->tbs).p;
    local_98 = &crt->version;
    local_90 = puVar4 + (long)__size;
    iVar2 = mbedtls_asn1_get_tag(&local_b0,end,&local_70,0xa0);
    chain = local_a8;
    if (iVar2 == 0) {
      puVar4 = local_b0 + local_70;
      iVar2 = mbedtls_asn1_get_int(&local_b0,puVar4,local_98);
      if (iVar2 == 0) {
        iVar2 = -0x2266;
        if (local_b0 == puVar4) {
          iVar2 = 0;
        }
      }
      else {
        iVar2 = iVar2 + -0x2200;
      }
    }
    else if (iVar2 == -0x62) {
      *local_98 = 0;
      iVar2 = 0;
    }
    if ((iVar2 == 0) && (iVar2 = mbedtls_x509_get_serial(&local_b0,end,&crt->serial), iVar2 == 0)) {
      iVar2 = mbedtls_x509_get_alg(&local_b0,end,&crt->sig_oid,&local_88);
      if (iVar2 == 0) {
        if (2 < (uint)*local_98) {
          mbedtls_x509_crt_free(crt);
          iVar2 = -0x2580;
          goto LAB_0011befa;
        }
        crt->version = *local_98 + 1;
        iVar2 = mbedtls_x509_get_sig_alg
                          (&crt->sig_oid,&local_88,&crt->sig_md,&crt->sig_pk,&crt->sig_opts);
        if (iVar2 != 0) {
          mbedtls_x509_crt_free(crt);
          goto LAB_0011befa;
        }
        (crt->issuer_raw).p = local_b0;
        iVar2 = mbedtls_asn1_get_tag(&local_b0,end,&local_a0,0x30);
        if (iVar2 != 0) {
          mbedtls_x509_crt_free(crt);
          iVar2 = iVar2 + -0x2180;
          goto LAB_0011befa;
        }
        iVar2 = mbedtls_x509_get_name(&local_b0,local_b0 + local_a0,&crt->issuer);
        if (iVar2 == 0) {
          (crt->issuer_raw).len = (long)local_b0 - (long)(crt->issuer_raw).p;
          iVar2 = x509_get_dates(&local_b0,end,&crt->valid_from,&crt->valid_to);
          if (iVar2 == 0) {
            (crt->subject_raw).p = local_b0;
            iVar2 = mbedtls_asn1_get_tag(&local_b0,end,&local_a0,0x30);
            if (iVar2 != 0) {
              mbedtls_x509_crt_free(crt);
              iVar2 = iVar2 + -0x2180;
              chain = local_a8;
              goto LAB_0011befa;
            }
            if ((local_a0 == 0) ||
               (iVar2 = mbedtls_x509_get_name(&local_b0,local_b0 + local_a0,&crt->subject),
               iVar2 == 0)) {
              (crt->subject_raw).len = (long)local_b0 - (long)(crt->subject_raw).p;
              iVar2 = mbedtls_pk_parse_subpubkey(&local_b0,end,&crt->pk);
              if ((((iVar2 == 0) &&
                   (((*local_98 & 0xfffffffeU) != 2 ||
                    (iVar2 = x509_get_uid(&local_b0,end,&crt->issuer_id,1), iVar2 == 0)))) &&
                  (((*local_98 & 0xfffffffeU) != 2 ||
                   (iVar2 = x509_get_uid(&local_b0,end,&crt->subject_id,2), iVar2 == 0)))) &&
                 ((*local_98 != 3 || (iVar2 = x509_get_crt_ext(&local_b0,end,crt), iVar2 == 0)))) {
                if (local_b0 != end) {
LAB_0011c24d:
                  mbedtls_x509_crt_free(crt);
                  goto LAB_0011be1e;
                }
                iVar2 = mbedtls_x509_get_alg(&local_b0,local_90,&local_68,&local_48);
                if (iVar2 == 0) {
                  __n = (crt->sig_oid).len;
                  if ((((__n != local_68.len) ||
                       (iVar2 = bcmp((crt->sig_oid).p,local_68.p,__n), iVar2 != 0)) ||
                      (local_88.len != local_48.len)) ||
                     ((local_88.len != 0 &&
                      (iVar2 = bcmp(local_88.p,local_48.p,local_88.len), iVar2 != 0)))) {
                    mbedtls_x509_crt_free(crt);
                    iVar2 = -0x2680;
                    chain = local_a8;
                    goto LAB_0011befa;
                  }
                  iVar2 = mbedtls_x509_get_sig(&local_b0,local_90,&crt->sig);
                  if (iVar2 == 0) {
                    if (local_b0 == local_90) {
                      iVar2 = 0;
                      chain = local_a8;
                      goto LAB_0011befa;
                    }
                    goto LAB_0011c24d;
                  }
                }
              }
            }
          }
        }
        mbedtls_x509_crt_free(crt);
        chain = local_a8;
        goto LAB_0011befa;
      }
    }
    mbedtls_x509_crt_free(crt);
  }
LAB_0011befa:
  iVar7 = 0;
  if (iVar2 != 0) {
    if (pmVar6 != (mbedtls_x509_crt *)0x0) {
      pmVar6->next = (mbedtls_x509_crt *)0x0;
    }
    iVar7 = iVar2;
    if (crt != chain) {
      free(crt);
    }
  }
  return iVar7;
}

Assistant:

int mbedtls_x509_crt_parse_der( mbedtls_x509_crt *chain, const unsigned char *buf,
                        size_t buflen )
{
    int ret;
    mbedtls_x509_crt *crt = chain, *prev = NULL;

    /*
     * Check for valid input
     */
    if( crt == NULL || buf == NULL )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    while( crt->version != 0 && crt->next != NULL )
    {
        prev = crt;
        crt = crt->next;
    }

    /*
     * Add new certificate on the end of the chain if needed.
     */
    if( crt->version != 0 && crt->next == NULL )
    {
        crt->next = mbedtls_calloc( 1, sizeof( mbedtls_x509_crt ) );

        if( crt->next == NULL )
            return( MBEDTLS_ERR_X509_ALLOC_FAILED );

        prev = crt;
        mbedtls_x509_crt_init( crt->next );
        crt = crt->next;
    }

    if( ( ret = x509_crt_parse_der_core( crt, buf, buflen ) ) != 0 )
    {
        if( prev )
            prev->next = NULL;

        if( crt != chain )
            mbedtls_free( crt );

        return( ret );
    }

    return( 0 );
}